

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::SubRoutineLocLinkLocationMaxLocation::Run
          (SubRoutineLocLinkLocationMaxLocation *this)

{
  long lVar1;
  UniformValueGenerator *generator;
  DefOccurence local_204;
  LayoutSpecifierBase local_200;
  LayoutSpecifierBase local_1e0;
  SubroutineUniform local_1d0;
  undefined1 local_68 [8];
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunctionSet functions_st0;
  GLint max;
  SubRoutineLocLinkLocationMaxLocation *this_local;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8de8,
             (GLint *)(functions_st0.typeName.field_2._M_local_buf + 0xc));
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet
            ((SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,generator,2);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
            *)local_68);
  local_200 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C
                        (functions_st0.typeName.field_2._12_4_,Dec);
  local_1e0 = local_200;
  DefOccurence::DefOccurence(&local_204,FSH_OR_CSH);
  SubroutineUniform::SubroutineUniform
            (&local_1d0,generator,
             (SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Loc)local_1e0,0,local_204,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_68,&local_1d0);
  SubroutineUniform::~SubroutineUniform(&local_1d0);
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeLink
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      *)local_68);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             *)local_68);
  SubroutineFunctionSet::~SubroutineFunctionSet
            ((SubroutineFunctionSet *)
             &subroutineUniforms.
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//layout(location = N) subroutine uniform st0 u0;
		//Where X is substituted with value of GL_MAX_UNIFORM_LOCATIONS.

		GLint max;
		glGetIntegerv(GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS, &max);
		SubroutineFunctionSet		   functions_st0(uniformValueGenerator, 2);
		std::vector<SubroutineUniform> subroutineUniforms;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(max), 0, DefOccurence::FSH_OR_CSH));
		return doRunNegativeLink(subroutineUniforms);
	}